

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QExplicitlySharedDataPointer<QSslConfigurationPrivate>::~QExplicitlySharedDataPointer
          (QExplicitlySharedDataPointer<QSslConfigurationPrivate> *this)

{
  QSslConfigurationPrivate *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QSslConfigurationPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QSslConfigurationPrivate *)0x0) {
        QSslConfigurationPrivate::~QSslConfigurationPrivate(pQVar1);
      }
      operator_delete(pQVar1,0x140);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }